

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O2

void vkt::tessellation::anon_unknown_2::initCommonPrograms
               (SourceCollections *programCollection,CaseDefinition *caseDef)

{
  TessPrimitiveType TVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  allocator<char> local_201;
  string local_200;
  string local_1e0;
  undefined1 local_1c0 [40];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp vec2 in_v_position;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out highp vec2 in_tc_position;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_tc_position = in_v_position;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"vert",&local_201);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  TVar1 = caseDef->primitiveType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(vertices = ");
  poVar3 = (ostream *)
           std::ostream::operator<<(poVar3,4 - (uint)(TVar1 == TESSPRIMITIVETYPE_TRIANGLES));
  poVar3 = std::operator<<(poVar3,") out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,
                           "layout(set = 0, binding = 0, std430) readonly restrict buffer TessLevels {\n    float inner0;\n    float inner1;\n    float outer0;\n    float outer1;\n    float outer2;\n    float outer3;\n} sb_levels;\n"
                          );
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp vec2 in_tc_position[];\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out highp vec2 in_te_position[];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,
                           "    in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
                          );
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = sb_levels.inner0;\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = sb_levels.inner1;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = sb_levels.outer0;\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = sb_levels.outer1;\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = sb_levels.outer2;\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = sb_levels.outer3;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"tesc",&local_201);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)&src,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp   vec4 in_f_color;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out mediump vec4 o_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    o_color = in_f_color;\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"frag",&local_201);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1c0,&local_200);
  glu::ProgramSources::operator<<(pPVar4,(ShaderSource *)local_1c0);
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void initCommonPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	DE_ASSERT(!programCollection.glslSources.contains("vert"));
	DE_ASSERT(!programCollection.glslSources.contains("tesc"));
	DE_ASSERT(!programCollection.glslSources.contains("frag"));

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_v_position;\n"
			<< "layout(location = 0) out highp vec2 in_tc_position;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_position = in_v_position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		const int numVertices = (caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 3 : 4);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = " << numVertices << ") out;\n"
			<< "\n"
			<< getTessLevelsSSBODeclaration()
			<< "\n"
			<< "layout(location = 0) in  highp vec2 in_tc_position[];\n"
			<< "layout(location = 0) out highp vec2 in_te_position[];\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = sb_levels.inner0;\n"
			<< "    gl_TessLevelInner[1] = sb_levels.inner1;\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = sb_levels.outer0;\n"
			<< "    gl_TessLevelOuter[1] = sb_levels.outer1;\n"
			<< "    gl_TessLevelOuter[2] = sb_levels.outer2;\n"
			<< "    gl_TessLevelOuter[3] = sb_levels.outer3;\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp   vec4 in_f_color;\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = in_f_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}